

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O0

curl_slist * slist_get_last(curl_slist *list)

{
  curl_slist *local_20;
  curl_slist *item;
  curl_slist *list_local;
  
  local_20 = list;
  if (list == (curl_slist *)0x0) {
    list_local = (curl_slist *)0x0;
  }
  else {
    for (; local_20->next != (curl_slist *)0x0; local_20 = local_20->next) {
    }
    list_local = local_20;
  }
  return list_local;
}

Assistant:

static struct curl_slist *slist_get_last(struct curl_slist *list)
{
  struct curl_slist     *item;

  /* if caller passed us a NULL, return now */
  if(!list)
    return NULL;

  /* loop through to find the last item */
  item = list;
  while(item->next) {
    item = item->next;
  }
  return item;
}